

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  pointer pbVar6;
  bool bVar7;
  string les;
  string local_name;
  undefined1 local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string *local_140;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  long local_130;
  char local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  long local_f0;
  char local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  long local_d0;
  char local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_t local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  local_140 = name_to_check;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (this->name_)._M_string_length);
  if (this->ignore_underscore_ == true) {
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_d8._M_current = &local_c8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,pcVar2 + (this->name_)._M_string_length);
    local_118._M_dataplus._M_p._0_1_ = 0x5f;
    _Var5 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_d8,local_d8._M_current + local_d0,
                       (_Iter_equals_val<const_char>)&local_118);
    local_160._M_string_length = (long)_Var5._M_current - (long)local_d8._M_current;
    *_Var5._M_current = '\0';
    paVar1 = &local_160.field_2;
    if (local_d8._M_current == &local_c8) {
      local_160.field_2._8_8_ = uStack_c0;
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160._M_dataplus._M_p = local_d8._M_current;
    }
    local_160.field_2._M_allocated_capacity._1_7_ = uStack_c7;
    local_160.field_2._M_local_buf[0] = local_c8;
    local_d0 = 0;
    local_c8 = '\0';
    local_d8._M_current = &local_c8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_58,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_d8._M_current != &local_c8) {
      operator_delete(local_d8._M_current,CONCAT71(uStack_c7,local_c8) + 1);
    }
    pcVar2 = (local_140->_M_dataplus)._M_p;
    local_f8._M_current = &local_e8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + local_140->_M_string_length);
    local_118._M_dataplus._M_p._0_1_ = 0x5f;
    _Var5 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_f8,local_f8._M_current + local_f0,
                       (_Iter_equals_val<const_char>)&local_118);
    local_160._M_string_length = (long)_Var5._M_current - (long)local_f8._M_current;
    *_Var5._M_current = '\0';
    if (local_f8._M_current == &local_e8) {
      local_160.field_2._8_8_ = uStack_e0;
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160._M_dataplus._M_p = local_f8._M_current;
    }
    local_160.field_2._M_allocated_capacity._1_7_ = uStack_e7;
    local_160.field_2._M_local_buf[0] = local_e8;
    local_f0 = 0;
    local_e8 = '\0';
    local_f8._M_current = &local_e8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_140,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_f8._M_current != &local_e8) {
      operator_delete(local_f8._M_current,CONCAT71(uStack_e7,local_e8) + 1);
    }
  }
  if (this->ignore_case_ == true) {
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_78 = &local_68;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + (this->name_)._M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_78,local_78->_M_local_buf + local_70,local_78);
    paVar1 = &local_160.field_2;
    if (local_78 == &local_68) {
      local_160.field_2._8_8_ = local_68._8_8_;
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160._M_dataplus._M_p = (pointer)local_78;
    }
    local_160.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
    local_160.field_2._M_local_buf[0] = local_68._M_local_buf[0];
    local_160._M_string_length = local_70;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_78 = &local_68;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_58,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,
                                        local_68._M_local_buf[0]) + 1);
    }
    pcVar2 = (local_140->_M_dataplus)._M_p;
    local_98 = &local_88;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + local_140->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_98,local_98->_M_local_buf + local_90,local_98);
    if (local_98 == &local_88) {
      local_160.field_2._8_8_ = local_88._8_8_;
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160._M_dataplus._M_p = (pointer)local_98;
    }
    local_160.field_2._M_allocated_capacity._1_7_ = local_88._M_allocated_capacity._1_7_;
    local_160.field_2._M_local_buf[0] = local_88._M_local_buf[0];
    local_160._M_string_length = local_90;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_98 = &local_88;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_140,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(local_88._M_allocated_capacity._1_7_,
                                        local_88._M_local_buf[0]) + 1);
    }
  }
  if (local_58._M_string_length == local_140->_M_string_length) {
    bVar7 = true;
    if (local_58._M_string_length == 0) goto LAB_0019f18e;
    iVar4 = bcmp(local_58._M_dataplus._M_p,(local_140->_M_dataplus)._M_p,local_58._M_string_length);
    bVar7 = true;
    if (iVar4 == 0) goto LAB_0019f18e;
  }
  pbVar6 = (this->aliases_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->aliases_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 == local_38) {
    bVar7 = false;
  }
  else {
    paVar1 = &local_118.field_2;
    do {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar2,pcVar2 + pbVar6->_M_string_length);
      if (this->ignore_underscore_ == true) {
        local_138._M_current = &local_128;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_160._M_dataplus._M_p,
                   local_160._M_dataplus._M_p + local_160._M_string_length);
        local_161 = 0x5f;
        _Var5 = ::std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_138,local_138._M_current + local_130,
                           (_Iter_equals_val<const_char>)&local_161);
        local_118._M_string_length = (long)_Var5._M_current - (long)local_138._M_current;
        *_Var5._M_current = '\0';
        if (local_138._M_current == &local_128) {
          local_118.field_2._8_8_ = uStack_120;
          local_118._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_118._M_dataplus._M_p = local_138._M_current;
        }
        local_118.field_2._M_allocated_capacity._1_7_ = uStack_127;
        local_118.field_2._M_local_buf[0] = local_128;
        local_130 = 0;
        local_128 = '\0';
        local_138._M_current = &local_128;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_160,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar1) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (local_138._M_current != &local_128) {
          operator_delete(local_138._M_current,CONCAT71(uStack_127,local_128) + 1);
        }
      }
      if (this->ignore_case_ == true) {
        local_b8 = &local_a8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_160._M_dataplus._M_p,
                   local_160._M_dataplus._M_p + local_160._M_string_length);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_b8,local_b8->_M_local_buf + local_b0,local_b8);
        if (local_b8 == &local_a8) {
          local_118.field_2._8_8_ = local_a8._8_8_;
          local_118._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_118._M_dataplus._M_p = (pointer)local_b8;
        }
        local_118.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
        local_118.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
        local_118._M_string_length = local_b0;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        local_b8 = &local_a8;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_160,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar1) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,
                                            local_a8._M_local_buf[0]) + 1);
        }
      }
      _Var3._M_p = local_160._M_dataplus._M_p;
      if (local_160._M_string_length == local_140->_M_string_length) {
        if (local_160._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar4 = bcmp(local_160._M_dataplus._M_p,(local_140->_M_dataplus)._M_p,
                       local_160._M_string_length);
          bVar7 = iVar4 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_160.field_2) {
        operator_delete(_Var3._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != local_38 && bVar7 == false);
  }
LAB_0019f18e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::check_name(std::string name_to_check) const {
    std::string local_name = name_;
    if(ignore_underscore_) {
        local_name = detail::remove_underscore(name_);
        name_to_check = detail::remove_underscore(name_to_check);
    }
    if(ignore_case_) {
        local_name = detail::to_lower(name_);
        name_to_check = detail::to_lower(name_to_check);
    }

    if(local_name == name_to_check) {
        return true;
    }
    for(std::string les : aliases_) {  // NOLINT(performance-for-range-copy)
        if(ignore_underscore_) {
            les = detail::remove_underscore(les);
        }
        if(ignore_case_) {
            les = detail::to_lower(les);
        }
        if(les == name_to_check) {
            return true;
        }
    }
    return false;
}